

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabConv.cpp
# Opt level: O1

istream * amrex::operator>>(istream *is,RealDescriptor *rd)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  char c_2;
  char c;
  Vector<int,_std::allocator<int>_> ord;
  Vector<long,_std::allocator<long>_> fmt;
  int size;
  char local_8a;
  char local_89;
  vector<int,_std::allocator<int>_> local_88;
  vector<long,_std::allocator<long>_> local_68;
  RealDescriptor local_50;
  
  std::operator>>(is,&local_89);
  if (local_89 != '(') {
    Error_host("operator>>(istream&,RealDescriptor&): expected a \'(\'");
  }
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (Long *)0x0;
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::operator>>(is,(char *)&local_88);
  if ((char)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != '(') {
    Error_host("getarray(istream&): expected a \'(\'");
  }
  std::istream::operator>>((istream *)is,(int *)&local_50);
  std::operator>>(is,(char *)&local_88);
  if ((char)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != ',') {
    Error_host("getarray(istream&): expected a \',\'");
  }
  std::operator>>(is,(char *)&local_88);
  if ((char)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != '(') {
    Error_host("getarray(istream&): expected a \'(\'");
  }
  std::vector<long,_std::allocator<long>_>::resize
            (&local_68,
             (long)(int)local_50.fr.super_vector<long,_std::allocator<long>_>.
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
  if (0 < (int)local_50.fr.super_vector<long,_std::allocator<long>_>.
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_start) {
    lVar2 = 0;
    do {
      std::istream::_M_extract<long>((long *)is);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (int)local_50.fr.super_vector<long,_std::allocator<long>_>.
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::operator>>(is,(char *)&local_88);
  if ((char)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != ')') {
    Error_host("getarray(istream&): expected a \')\'");
  }
  std::operator>>(is,(char *)&local_88);
  if ((char)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != ')') {
    Error_host("getarray(istream&): expected a \')\'");
  }
  std::operator>>(is,&local_89);
  if (local_89 != ',') {
    Error_host("operator>>(istream&,RealDescriptor&): expected a \',\'");
  }
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::operator>>(is,&local_8a);
  if (local_8a != '(') {
    Error_host("getarray(istream&): expected a \'(\'");
  }
  std::istream::operator>>((istream *)is,(int *)&local_50);
  std::operator>>(is,&local_8a);
  if (local_8a != ',') {
    Error_host("getarray(istream&): expected a \',\'");
  }
  std::operator>>(is,&local_8a);
  if (local_8a != '(') {
    Error_host("getarray(istream&): expected a \'(\'");
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&local_88,
             (long)(int)local_50.fr.super_vector<long,_std::allocator<long>_>.
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
  if (0 < (int)local_50.fr.super_vector<long,_std::allocator<long>_>.
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_start) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      std::istream::operator>>
                ((istream *)is,
                 (int *)((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar3));
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 4;
    } while (lVar2 < (int)local_50.fr.super_vector<long,_std::allocator<long>_>.
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::operator>>(is,&local_8a);
  if (local_8a != ')') {
    Error_host("getarray(istream&): expected a \')\'");
  }
  std::operator>>(is,&local_8a);
  if (local_8a != ')') {
    Error_host("getarray(istream&): expected a \')\'");
  }
  std::operator>>(is,&local_89);
  if (local_89 != ')') {
    Error_host("operator>>(istream&,RealDescriptor&): expected a \')\'");
  }
  RealDescriptor::RealDescriptor
            (&local_50,
             local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(int)((ulong)((long)local_88.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_88.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start) >> 2));
  std::vector<long,_std::allocator<long>_>::_M_move_assign
            ((vector<long,_std::allocator<long>_> *)rd,&local_50);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&(rd->ord).super_vector<int,_std::allocator<int>_>,&local_50.ord);
  if (local_50.ord.super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_50.ord.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_50.ord.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_50.ord.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  pvVar1 = (void *)CONCAT44(local_50.fr.super_vector<long,_std::allocator<long>_>.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)local_50.fr.super_vector<long,_std::allocator<long>_>.
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_50.fr.super_vector<long,_std::allocator<long>_>.
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (Long *)0x0) {
    operator_delete(local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return is;
}

Assistant:

std::istream&
operator>> (std::istream&   is,
            RealDescriptor& rd)
{
    char c;
    is >> c;
    if (c != '(')
        amrex::Error("operator>>(istream&,RealDescriptor&): expected a \'(\'");
    Vector<Long> fmt;
    getarray(is, fmt);
    is >> c;
    if (c != ',')
        amrex::Error("operator>>(istream&,RealDescriptor&): expected a \',\'");
    Vector<int> ord;
    getarray(is, ord);
    is >> c;
    if (c != ')')
        amrex::Error("operator>>(istream&,RealDescriptor&): expected a \')\'");
    rd = RealDescriptor(fmt.dataPtr(),ord.dataPtr(),ord.size());
    return is;
}